

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_host_buffer.cpp
# Opt level: O3

void __thiscall gpu::shared_host_buffer::resize(shared_host_buffer *this,size_t size)

{
  Type TVar1;
  long *plVar2;
  void *pvVar3;
  undefined8 *puVar4;
  Context context;
  string local_80;
  string local_60;
  Context local_40;
  
  if (this->size_ != size) {
    decref(this);
    plVar2 = (long *)operator_new__(8);
    this->buffer_ = (uchar *)plVar2;
    *plVar2 = 0;
    LOCK();
    *plVar2 = *plVar2 + 1;
    UNLOCK();
    Context::Context(&local_40);
    TVar1 = Context::type(&local_40);
    if (TVar1 == TypeOpenCL) {
      pvVar3 = malloc(size);
      this->data_ = pvVar3;
      if (pvVar3 == (void *)0x0) {
        puVar4 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar4 = operator_delete;
        __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
    }
    else {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/PolarNick239[P]ExternalSortingOnGPU/libs/gpu/libgpu/shared_host_buffer.cpp"
                 ,"");
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"No GPU context!","");
      raiseException(&local_60,0x9e,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
    }
    this->type_ = TVar1;
    this->size_ = size;
    if (local_40.data_ref_.super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.data_ref_.
                 super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  return;
}

Assistant:

void shared_host_buffer::resize(size_t size)
{
	if (size == size_)
		return;

	decref();

	buffer_	= new unsigned char [8];
	* (long long *) buffer_ = 0;
	incref();

	Context context;
	Context::Type type = context.type();

	switch (type) {
#ifdef CUDA_SUPPORT
	case Context::TypeCUDA:
		CUDA_SAFE_CALL( cudaMallocHost(&data_, size) );
		break;
#endif
	case Context::TypeOpenCL:
		// NOTTODO: implement pinned memory in opencl
		// currently we use a plain paged memory buffer
		data_ = malloc(size);
		if (!data_)
			throw std::bad_alloc();
		break;
	default:
		gpu::raiseException(__FILE__, __LINE__, "No GPU context!");
	}

	type_ = type;
	size_ = size;
}